

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void __thiscall coins_tests::ccoins_add::test_method(ccoins_add *this)

{
  int *in_R8;
  uint *puVar1;
  bool *in_R9;
  uint uVar2;
  long in_FS_OFFSET;
  undefined1 local_41;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 3;
  local_40 = local_40 & 0xffffff00;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,int,bool>
            (&ABSENT,(long *)&NO_ENTRY,(long *)&local_3c,(char *)&local_40,in_R8,in_R9);
  local_3c = CONCAT31(local_3c._1_3_,1);
  puVar1 = &local_3c;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&ABSENT,&VALUE3,(long *)&NO_ENTRY,"\x01",(char *)puVar1,in_R9);
  local_3c = 0;
  uVar2 = 3;
  local_41 = 0;
  local_40 = uVar2;
  CheckAddCoin<long_const&,long_const&,long_const&,int,int,bool>
            (&SPENT,(long *)&local_3c,(long *)&local_40,(int *)&local_41,(int *)puVar1,in_R9);
  local_3c = 0;
  local_40._0_1_ = 1;
  puVar1 = &local_40;
  CheckAddCoin<long_const&,long_const&,long_const&,int,char_const&,bool>
            (&SPENT,&VALUE3,(long *)&local_3c,(int *)&DIRTY,(char *)puVar1,in_R9);
  local_40._0_1_ = 0;
  local_3c = uVar2;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,int,bool>
            (&SPENT,(long *)&FRESH,(long *)&local_3c,(char *)&local_40,(int *)puVar1,in_R9);
  local_40 = CONCAT31(local_40._1_3_,1);
  local_3c = uVar2;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,int,bool>
            (&SPENT,(long *)&FRESH,(long *)&local_3c,(char *)&local_40,(int *)puVar1,in_R9);
  local_3c = local_3c & 0xffffff00;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&SPENT,&VALUE3,(long *)&DIRTY,"\x01",(char *)&local_3c,in_R9);
  local_3c = CONCAT31(local_3c._1_3_,1);
  puVar1 = &local_3c;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&SPENT,&VALUE3,(long *)&DIRTY,"\x01",(char *)puVar1,in_R9);
  uVar2 = 3;
  local_41 = 0;
  local_40 = uVar2;
  local_3c = uVar2;
  CheckAddCoin<long_const&,long_const&,long_const&,int,int,bool>
            (&SPENT,(long *)&local_3c,(long *)&local_40,(int *)&local_41,(int *)puVar1,in_R9);
  local_41 = 1;
  local_40 = uVar2;
  local_3c = uVar2;
  CheckAddCoin<long_const&,long_const&,long_const&,int,int,bool>
            (&SPENT,(long *)&local_3c,(long *)&local_40,(int *)&local_41,(int *)puVar1,in_R9);
  local_3c = 0;
  local_40 = local_40 & 0xffffff00;
  CheckAddCoin<long_const&,long_const&,long_const&,int,char_const&,bool>
            (&VALUE2,&FAIL,(long *)&local_3c,(int *)&NO_ENTRY,(char *)&local_40,in_R9);
  local_3c = 0;
  local_40._0_1_ = 1;
  CheckAddCoin<long_const&,long_const&,long_const&,int,char_const&,bool>
            (&VALUE2,&VALUE3,(long *)&local_3c,(int *)&DIRTY,(char *)&local_40,in_R9);
  local_3c = local_3c & 0xffffff00;
  puVar1 = &local_3c;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&VALUE2,&FAIL,(long *)&FRESH,&NO_ENTRY,(char *)puVar1,in_R9);
  uVar2 = 3;
  local_40._0_1_ = 1;
  local_3c = uVar2;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,int,bool>
            (&VALUE2,(long *)&FRESH,(long *)&local_3c,(char *)&local_40,(int *)puVar1,in_R9);
  local_3c = local_3c & 0xffffff00;
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&VALUE2,&FAIL,(long *)&DIRTY,&NO_ENTRY,(char *)&local_3c,in_R9);
  local_3c = CONCAT31(local_3c._1_3_,1);
  CheckAddCoin<long_const&,long_const&,long_const&,char_const&,char_const&,bool>
            (&VALUE2,&VALUE3,(long *)&DIRTY,"\x01",(char *)&local_3c,in_R9);
  local_40 = (uint)local_40._1_3_ << 8;
  puVar1 = &local_40;
  local_3c = uVar2;
  CheckAddCoin<long_const&,long_const&,long_const&,int,char_const&,bool>
            (&VALUE2,&FAIL,(long *)&local_3c,(int *)&NO_ENTRY,(char *)puVar1,in_R9);
  local_41 = 1;
  local_40 = uVar2;
  local_3c = uVar2;
  CheckAddCoin<long_const&,long_const&,long_const&,int,int,bool>
            (&VALUE2,(long *)&local_3c,(long *)&local_40,(int *)&local_41,(int *)puVar1,in_R9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_add)
{
    /* Check AddCoin behavior, requesting a new coin from a cache view,
     * writing a modification to the coin, and then checking the resulting
     * entry in the cache after the modification. Verify behavior with the
     * AddCoin possible_overwrite argument set to false, and to true.
     *
     *           Cache   Write   Result  Cache        Result       possible_overwrite
     *           Value   Value   Value   Flags        Flags
     */
    CheckAddCoin(ABSENT, VALUE3, VALUE3, NO_ENTRY   , DIRTY|FRESH, false);
    CheckAddCoin(ABSENT, VALUE3, VALUE3, NO_ENTRY   , DIRTY      , true );
    CheckAddCoin(SPENT , VALUE3, VALUE3, 0          , DIRTY|FRESH, false);
    CheckAddCoin(SPENT , VALUE3, VALUE3, 0          , DIRTY      , true );
    CheckAddCoin(SPENT , VALUE3, VALUE3, FRESH      , DIRTY|FRESH, false);
    CheckAddCoin(SPENT , VALUE3, VALUE3, FRESH      , DIRTY|FRESH, true );
    CheckAddCoin(SPENT , VALUE3, VALUE3, DIRTY      , DIRTY      , false);
    CheckAddCoin(SPENT , VALUE3, VALUE3, DIRTY      , DIRTY      , true );
    CheckAddCoin(SPENT , VALUE3, VALUE3, DIRTY|FRESH, DIRTY|FRESH, false);
    CheckAddCoin(SPENT , VALUE3, VALUE3, DIRTY|FRESH, DIRTY|FRESH, true );
    CheckAddCoin(VALUE2, VALUE3, FAIL  , 0          , NO_ENTRY   , false);
    CheckAddCoin(VALUE2, VALUE3, VALUE3, 0          , DIRTY      , true );
    CheckAddCoin(VALUE2, VALUE3, FAIL  , FRESH      , NO_ENTRY   , false);
    CheckAddCoin(VALUE2, VALUE3, VALUE3, FRESH      , DIRTY|FRESH, true );
    CheckAddCoin(VALUE2, VALUE3, FAIL  , DIRTY      , NO_ENTRY   , false);
    CheckAddCoin(VALUE2, VALUE3, VALUE3, DIRTY      , DIRTY      , true );
    CheckAddCoin(VALUE2, VALUE3, FAIL  , DIRTY|FRESH, NO_ENTRY   , false);
    CheckAddCoin(VALUE2, VALUE3, VALUE3, DIRTY|FRESH, DIRTY|FRESH, true );
}